

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O1

bool jbcoin::operator==(Book *lhs,Book *rhs)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = compare(&lhs->in,&rhs->in);
  if (iVar1 == 0) {
    iVar1 = compare(&lhs->out,&rhs->out);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
operator== (Book const& lhs, Book const& rhs)
{
    return (lhs.in == rhs.in) &&
           (lhs.out == rhs.out);
}